

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_fractional.c
# Opt level: O1

void WebRtcSpl_Resample32khzTo24khz(int32_t *In,int32_t *Out,size_t K)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  
  if (K != 0) {
    do {
      *Out = In[7] * 0x5a + 0x4000 +
             In[6] * 0x2d1 + In[5] * -0xefe + In[4] * 0x297c +
             In[3] * 0x5f56 + In[2] * 0x982 + In[1] * -0x93a + *In * 0x2ff;
      Out[1] = (In[8] + In[1]) * 0x182 + (In[7] + In[2]) * -0x17d +
               (In[6] + In[3]) * -0xa56 + (In[5] + In[4]) * 0x4a76 + 0x4000;
      piVar1 = In + 2;
      piVar2 = In + 3;
      piVar3 = In + 4;
      piVar4 = In + 5;
      piVar5 = In + 6;
      piVar6 = In + 7;
      piVar7 = In + 8;
      piVar8 = In + 9;
      In = In + 4;
      Out[2] = *piVar8 * 0x2ff + 0x4000 +
               *piVar7 * -0x93a + *piVar6 * 0x982 + *piVar5 * 0x5f56 +
               *piVar4 * 0x297c + *piVar3 * -0xefe + *piVar2 * 0x2d1 + *piVar1 * 0x5a;
      Out = Out + 3;
      K = K - 1;
    } while (K != 0);
  }
  return;
}

Assistant:

void WebRtcSpl_Resample32khzTo24khz(const int32_t *In, int32_t *Out, size_t K)
{
    /////////////////////////////////////////////////////////////
    // Filter operation:
    //
    // Perform resampling (4 input samples -> 3 output samples);
    // process in sub blocks of size 4 samples.
    size_t m;
    int32_t tmp;

    for (m = 0; m < K; m++)
    {
        tmp = 1 << 14;
        tmp += kCoefficients32To24[0][0] * In[0];
        tmp += kCoefficients32To24[0][1] * In[1];
        tmp += kCoefficients32To24[0][2] * In[2];
        tmp += kCoefficients32To24[0][3] * In[3];
        tmp += kCoefficients32To24[0][4] * In[4];
        tmp += kCoefficients32To24[0][5] * In[5];
        tmp += kCoefficients32To24[0][6] * In[6];
        tmp += kCoefficients32To24[0][7] * In[7];
        Out[0] = tmp;

        tmp = 1 << 14;
        tmp += kCoefficients32To24[1][0] * In[1];
        tmp += kCoefficients32To24[1][1] * In[2];
        tmp += kCoefficients32To24[1][2] * In[3];
        tmp += kCoefficients32To24[1][3] * In[4];
        tmp += kCoefficients32To24[1][4] * In[5];
        tmp += kCoefficients32To24[1][5] * In[6];
        tmp += kCoefficients32To24[1][6] * In[7];
        tmp += kCoefficients32To24[1][7] * In[8];
        Out[1] = tmp;

        tmp = 1 << 14;
        tmp += kCoefficients32To24[2][0] * In[2];
        tmp += kCoefficients32To24[2][1] * In[3];
        tmp += kCoefficients32To24[2][2] * In[4];
        tmp += kCoefficients32To24[2][3] * In[5];
        tmp += kCoefficients32To24[2][4] * In[6];
        tmp += kCoefficients32To24[2][5] * In[7];
        tmp += kCoefficients32To24[2][6] * In[8];
        tmp += kCoefficients32To24[2][7] * In[9];
        Out[2] = tmp;

        // update pointers
        In += 4;
        Out += 3;
    }
}